

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O1

void __thiscall rest_rpc::rpc_client::send_subscribe(rpc_client *this,string *key,string *token)

{
  char *pcVar1;
  char *message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  pointer *__ptr;
  long lVar2;
  buffer_type ret;
  msgpack_codec codec;
  buffer_type local_50;
  undefined4 local_38;
  zone *local_20;
  
  local_38 = 0;
  local_20 = (zone *)0x0;
  rpc_service::msgpack_codec::pack_args<std::__cxx11::string_const&,std::__cxx11::string_const&>
            (&local_50,(msgpack_codec *)key,token,in_RCX);
  message = (key->_M_dataplus)._M_p;
  lVar2 = 0;
  do {
    pcVar1 = message + lVar2;
    lVar2 = lVar2 + 1;
  } while (*pcVar1 != '\0');
  MD5::MD5CE::ProcessMessage(message,(int)lVar2 - 1);
  write(this,0,(void *)0x1,(size_t)&local_50);
  free(local_50.m_data);
  if (local_20 != (zone *)0x0) {
    std::default_delete<msgpack::v1::zone>::operator()
              ((default_delete<msgpack::v1::zone> *)&local_20,local_20);
  }
  return;
}

Assistant:

void send_subscribe(const std::string &key, const std::string &token) {
    rpc_service::msgpack_codec codec;
    auto ret = codec.pack_args(key, token);
    write(0, request_type::sub_pub, std::move(ret), MD5::MD5Hash32(key.data()));
  }